

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void init::AddLoggingArgs(ArgsManager *argsman)

{
  Logger *help;
  Logger *pLVar1;
  string *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffae8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb10;
  Logger *in_stack_fffffffffffffb18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb20;
  allocator<char> *in_stack_fffffffffffffb28;
  allocator<char> *__a;
  Logger *in_stack_fffffffffffffb30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  OptionsCategory *in_stack_fffffffffffffb68;
  allocator<char> *cat;
  undefined8 in_stack_fffffffffffffb70;
  uint uVar2;
  string *in_stack_fffffffffffffb78;
  string *in_stack_fffffffffffffb80;
  string *name;
  ArgsManager *in_stack_fffffffffffffb88;
  ArgsManager *this_00;
  allocator<char> local_402;
  allocator<char> local_401;
  undefined4 local_400;
  allocator<char> local_3fa;
  allocator<char> local_3f9;
  undefined4 local_3f8;
  allocator<char> local_3f1;
  undefined4 local_3f0;
  undefined1 local_3e9 [9];
  undefined4 local_3e0;
  allocator<char> local_3d9 [8];
  allocator<char> local_3d1 [8];
  undefined1 local_3c9 [15];
  allocator<char> local_3ba;
  allocator<char> local_3b9 [8];
  allocator<char> local_3b1 [8];
  allocator<char> local_3a9 [929];
  long local_8;
  
  uVar2 = (uint)((ulong)in_stack_fffffffffffffb70 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  tinyformat::format<char_const*>
            ((char *)in_stack_fffffffffffffb18,(char **)in_stack_fffffffffffffb10);
  local_3b1[1] = (allocator<char>)0x0;
  local_3b1[2] = (allocator<char>)0x0;
  local_3b1[3] = (allocator<char>)0x0;
  local_3b1[4] = (allocator<char>)0x0;
  ArgsManager::AddArg(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
                      uVar2,in_stack_fffffffffffffb68);
  std::__cxx11::string::~string(in_stack_fffffffffffffae8);
  std::__cxx11::string::~string(in_stack_fffffffffffffae8);
  std::allocator<char>::~allocator(local_3a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  LogInstance();
  BCLog::Logger::LogCategoriesString_abi_cxx11_(in_stack_fffffffffffffb18);
  std::operator+((char *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
  std::operator+(in_stack_fffffffffffffb00,(char *)in_stack_fffffffffffffaf8);
  local_3b9[1] = (allocator<char>)0x5;
  local_3b9[2] = (allocator<char>)0x0;
  local_3b9[3] = (allocator<char>)0x0;
  local_3b9[4] = (allocator<char>)0x0;
  ArgsManager::AddArg(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
                      uVar2,in_stack_fffffffffffffb68);
  std::__cxx11::string::~string(in_stack_fffffffffffffae8);
  std::__cxx11::string::~string(in_stack_fffffffffffffae8);
  std::__cxx11::string::~string(in_stack_fffffffffffffae8);
  std::__cxx11::string::~string(in_stack_fffffffffffffae8);
  std::allocator<char>::~allocator(local_3b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  local_3c9._9_4_ = 5;
  ArgsManager::AddArg(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
                      uVar2,in_stack_fffffffffffffb68);
  std::__cxx11::string::~string(in_stack_fffffffffffffae8);
  std::allocator<char>::~allocator(&local_3ba);
  std::__cxx11::string::~string(in_stack_fffffffffffffae8);
  std::allocator<char>::~allocator(local_3b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  tinyformat::format<bool>((char *)in_stack_fffffffffffffb18,(bool *)in_stack_fffffffffffffb10);
  local_3c9._1_4_ = 5;
  ArgsManager::AddArg(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
                      uVar2,in_stack_fffffffffffffb68);
  std::__cxx11::string::~string(in_stack_fffffffffffffae8);
  std::__cxx11::string::~string(in_stack_fffffffffffffae8);
  std::allocator<char>::~allocator((allocator<char> *)(local_3c9 + 8));
  this_00 = (ArgsManager *)local_3c9;
  name = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  help = LogInstance();
  BCLog::Logger::LogLevelsString_abi_cxx11_(in_stack_fffffffffffffb30);
  LogInstance();
  BCLog::Logger::LogLevelToStr_abi_cxx11_((Level)((ulong)in_stack_fffffffffffffb38 >> 0x20));
  pLVar1 = LogInstance();
  uVar2 = (uint)((ulong)pLVar1 >> 0x20);
  BCLog::Logger::LogCategoriesString_abi_cxx11_(in_stack_fffffffffffffb18);
  tinyformat::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            ((char *)in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  local_3d1[1] = (allocator<char>)0x5;
  local_3d1[2] = (allocator<char>)0x0;
  local_3d1[3] = (allocator<char>)0x0;
  local_3d1[4] = (allocator<char>)0x0;
  ArgsManager::AddArg(this_00,name,(string *)help,uVar2,in_stack_fffffffffffffb68);
  std::__cxx11::string::~string(in_stack_fffffffffffffae8);
  std::__cxx11::string::~string(in_stack_fffffffffffffae8);
  std::__cxx11::string::~string(in_stack_fffffffffffffae8);
  std::__cxx11::string::~string(in_stack_fffffffffffffae8);
  std::__cxx11::string::~string(in_stack_fffffffffffffae8);
  std::allocator<char>::~allocator((allocator<char> *)local_3c9);
  cat = local_3d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  tinyformat::format<bool>((char *)in_stack_fffffffffffffb18,(bool *)in_stack_fffffffffffffb10);
  local_3d9[1] = (allocator<char>)0x5;
  local_3d9[2] = (allocator<char>)0x0;
  local_3d9[3] = (allocator<char>)0x0;
  local_3d9[4] = (allocator<char>)0x0;
  ArgsManager::AddArg(this_00,name,(string *)help,uVar2,(OptionsCategory *)cat);
  std::__cxx11::string::~string(in_stack_fffffffffffffae8);
  std::__cxx11::string::~string(in_stack_fffffffffffffae8);
  std::allocator<char>::~allocator(local_3d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  tinyformat::format<bool>((char *)in_stack_fffffffffffffb18,(bool *)in_stack_fffffffffffffb10);
  local_3e0 = 5;
  ArgsManager::AddArg(this_00,name,(string *)help,uVar2,(OptionsCategory *)cat);
  std::__cxx11::string::~string(in_stack_fffffffffffffae8);
  std::__cxx11::string::~string(in_stack_fffffffffffffae8);
  std::allocator<char>::~allocator(local_3d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  tinyformat::format<bool>((char *)in_stack_fffffffffffffb18,(bool *)in_stack_fffffffffffffb10);
  local_3e9._1_4_ = 5;
  ArgsManager::AddArg(this_00,name,(string *)help,uVar2,(OptionsCategory *)cat);
  std::__cxx11::string::~string(in_stack_fffffffffffffae8);
  std::__cxx11::string::~string(in_stack_fffffffffffffae8);
  std::allocator<char>::~allocator((allocator<char> *)(local_3e9 + 8));
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)in_RDI,in_stack_fffffffffffffb28);
  tinyformat::format<bool>((char *)in_stack_fffffffffffffb18,(bool *)in_stack_fffffffffffffb10);
  local_3f0 = 5;
  ArgsManager::AddArg(this_00,name,(string *)help,uVar2,(OptionsCategory *)cat);
  std::__cxx11::string::~string(in_stack_fffffffffffffae8);
  std::__cxx11::string::~string(in_stack_fffffffffffffae8);
  std::allocator<char>::~allocator((allocator<char> *)local_3e9);
  __a = &local_3f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)in_RDI,__a);
  tinyformat::format<bool>((char *)in_stack_fffffffffffffb18,(bool *)in_stack_fffffffffffffb10);
  local_3f8 = 5;
  ArgsManager::AddArg(this_00,name,(string *)help,uVar2,(OptionsCategory *)cat);
  std::__cxx11::string::~string(in_stack_fffffffffffffae8);
  std::__cxx11::string::~string(in_stack_fffffffffffffae8);
  std::allocator<char>::~allocator(&local_3f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)in_RDI,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)in_RDI,__a);
  local_400 = 5;
  ArgsManager::AddArg(this_00,name,(string *)help,uVar2,(OptionsCategory *)cat);
  std::__cxx11::string::~string(in_stack_fffffffffffffae8);
  std::allocator<char>::~allocator(&local_3fa);
  std::__cxx11::string::~string(in_stack_fffffffffffffae8);
  std::allocator<char>::~allocator(&local_3f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)in_RDI,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)in_RDI,__a);
  ArgsManager::AddArg(this_00,name,(string *)help,uVar2,(OptionsCategory *)cat);
  std::__cxx11::string::~string(in_stack_fffffffffffffae8);
  std::allocator<char>::~allocator(&local_402);
  std::__cxx11::string::~string(in_stack_fffffffffffffae8);
  std::allocator<char>::~allocator(&local_401);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AddLoggingArgs(ArgsManager& argsman)
{
    argsman.AddArg("-debuglogfile=<file>", strprintf("Specify location of debug log file (default: %s). Relative paths will be prefixed by a net-specific datadir location. Pass -nodebuglogfile to disable writing the log to a file.", DEFAULT_DEBUGLOGFILE), ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-debug=<category>", "Output debug and trace logging (default: -nodebug, supplying <category> is optional). "
        "If <category> is not supplied or if <category> is 1 or \"all\", output all debug logging. If <category> is 0 or \"none\", any other categories are ignored. Other valid values for <category> are: " + LogInstance().LogCategoriesString() + ". This option can be specified multiple times to output multiple categories.",
        ArgsManager::ALLOW_ANY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-debugexclude=<category>", "Exclude debug and trace logging for a category. Can be used in conjunction with -debug=1 to output debug and trace logging for all categories except the specified category. This option can be specified multiple times to exclude multiple categories. This takes priority over \"-debug\"", ArgsManager::ALLOW_ANY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-logips", strprintf("Include IP addresses in debug output (default: %u)", DEFAULT_LOGIPS), ArgsManager::ALLOW_ANY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-loglevel=<level>|<category>:<level>", strprintf("Set the global or per-category severity level for logging categories enabled with the -debug configuration option or the logging RPC. Possible values are %s (default=%s). The following levels are always logged: error, warning, info. If <category>:<level> is supplied, the setting will override the global one and may be specified multiple times to set multiple category-specific levels. <category> can be: %s.", LogInstance().LogLevelsString(), LogInstance().LogLevelToStr(BCLog::DEFAULT_LOG_LEVEL), LogInstance().LogCategoriesString()), ArgsManager::DISALLOW_NEGATION | ArgsManager::DISALLOW_ELISION | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-logtimestamps", strprintf("Prepend debug output with timestamp (default: %u)", DEFAULT_LOGTIMESTAMPS), ArgsManager::ALLOW_ANY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-logthreadnames", strprintf("Prepend debug output with name of the originating thread (default: %u)", DEFAULT_LOGTHREADNAMES), ArgsManager::ALLOW_ANY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-logsourcelocations", strprintf("Prepend debug output with name of the originating source location (source file, line number and function name) (default: %u)", DEFAULT_LOGSOURCELOCATIONS), ArgsManager::ALLOW_ANY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-logtimemicros", strprintf("Add microsecond precision to debug timestamps (default: %u)", DEFAULT_LOGTIMEMICROS), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-loglevelalways", strprintf("Always prepend a category and level (default: %u)", DEFAULT_LOGLEVELALWAYS), ArgsManager::ALLOW_ANY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-printtoconsole", "Send trace/debug info to console (default: 1 when no -daemon. To disable logging to file, set -nodebuglogfile)", ArgsManager::ALLOW_ANY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-shrinkdebugfile", "Shrink debug.log file on client startup (default: 1 when no -debug)", ArgsManager::ALLOW_ANY, OptionsCategory::DEBUG_TEST);
}